

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

dtime_t duckdb::Time::NormalizeTimeTZ(dtime_tz_t timetz)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)((ulong)((uint)timetz.bits & 0xffffff) * 1000000 + -0xd692afdc0) % 86400000000 +
          (timetz.bits >> 0x18);
  if (lVar1 < 86400000000) {
    if (-1 < lVar1) {
      return (dtime_t)lVar1;
    }
    lVar2 = 86400000000;
  }
  else {
    lVar2 = -86400000000;
  }
  return (dtime_t)(lVar1 + lVar2);
}

Assistant:

dtime_t Time::NormalizeTimeTZ(dtime_tz_t timetz) {
	date_t date(0);
	return Interval::Add(timetz.time(), {0, 0, -timetz.offset() * Interval::MICROS_PER_SEC}, date);
}